

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

int WebPISetIOHooks(WebPIDecoder *idec,VP8IoPutHook put,VP8IoSetupHook setup,
                   VP8IoTeardownHook teardown,void *user_data)

{
  if ((idec != (WebPIDecoder *)0x0) && (idec->state == STATE_WEBP_HEADER)) {
    (idec->io).put = put;
    (idec->io).setup = setup;
    (idec->io).teardown = teardown;
    (idec->io).opaque = user_data;
    return 1;
  }
  return 0;
}

Assistant:

int WebPISetIOHooks(WebPIDecoder* const idec,
                    VP8IoPutHook put,
                    VP8IoSetupHook setup,
                    VP8IoTeardownHook teardown,
                    void* user_data) {
  if (idec == NULL || idec->state > STATE_WEBP_HEADER) {
    return 0;
  }

  idec->io.put = put;
  idec->io.setup = setup;
  idec->io.teardown = teardown;
  idec->io.opaque = user_data;

  return 1;
}